

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satIO.cpp
# Opt level: O3

bool write_exp_to_file(expression *exp,string *filename,bool terminal)

{
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  string exp_as_string;
  ofstream outputfile;
  string local_230;
  long local_210;
  filebuf local_208 [24];
  int aiStack_1f0 [54];
  ios_base local_118 [264];
  
  mathCore::as_string_abi_cxx11_
            (&local_230,(mathCore *)exp,(expression *)CONCAT71(in_register_00000011,terminal));
  if ((int)(expression *)CONCAT71(in_register_00000011,terminal) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n\n\nOutputExpression:\n",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_230._M_dataplus._M_p,local_230._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n\n",3);
  }
  std::ofstream::ofstream(&local_210,(string *)filename,_S_out|_S_app);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n\n",3);
  iVar1 = *(int *)((long)aiStack_1f0 + *(long *)(local_210 + -0x18));
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  return iVar1 == 0;
}

Assistant:

bool write_exp_to_file(expression* exp, std::string& filename, bool terminal) {
  std::string exp_as_string = mathCore::as_string(exp);
  bool success;

  if (terminal) {
    std::cout << "\n\n\nOutputExpression:\n" << exp_as_string << "\n\n\n";
  }

  std::ofstream outputfile(filename, std::ios::out | std::ios::app);
  outputfile << exp_as_string << "\n\n\n";
  success = outputfile.good();
  outputfile.close();
  return success;
}